

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

string * __thiscall
t_json_generator::get_qualified_name_abi_cxx11_
          (string *__return_storage_ptr__,t_json_generator *this,t_type *ttype)

{
  t_program *ptVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined4 extraout_var_00;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->should_merge_includes_ == false) &&
     (ptVar1 = ttype->program_, ptVar1 != (this->super_t_generator).program_)) {
    pcVar2 = (ptVar1->name_)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + (ptVar1->name_)._M_string_length);
    std::__cxx11::string::append((char *)local_40);
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,*(ulong *)CONCAT44(extraout_var,iVar4));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar3 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  else {
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar3 = *(long *)CONCAT44(extraout_var_00,iVar4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar3,
               ((long *)CONCAT44(extraout_var_00,iVar4))[1] + lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_json_generator::get_qualified_name(t_type* ttype) {
  if (should_merge_includes_ || ttype->get_program() == program_) {
    return ttype->get_name();
  }
  return ttype->get_program()->get_name() + "." + ttype->get_name();
}